

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

opj_codestream_index_t * j2k_get_cstr_index(opj_j2k_v2_t *p_j2k)

{
  uint uVar1;
  uint uVar2;
  opj_codestream_index_t *poVar3;
  opj_tile_index_t *poVar4;
  void *pvVar5;
  OPJ_OFF_T OVar6;
  opj_codestream_index_t *__ptr;
  opj_marker_info_t *__ptr_00;
  opj_tile_index_t *__ptr_01;
  void *pvVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  opj_marker_info_t **ppoVar11;
  bool bVar12;
  
  __ptr = (opj_codestream_index_t *)calloc(1,0x38);
  if (__ptr != (opj_codestream_index_t *)0x0) {
    poVar3 = p_j2k->cstr_index;
    OVar6 = poVar3->main_head_end;
    __ptr->main_head_start = poVar3->main_head_start;
    __ptr->main_head_end = OVar6;
    __ptr->codestream_size = poVar3->codestream_size;
    uVar1 = poVar3->marknum;
    __ptr->marknum = uVar1;
    sVar8 = (ulong)uVar1 * 0x18;
    __ptr_00 = (opj_marker_info_t *)malloc(sVar8);
    __ptr->marker = __ptr_00;
    if (__ptr_00 != (opj_marker_info_t *)0x0) {
      if (poVar3->marker == (opj_marker_info_t *)0x0) {
        free(__ptr_00);
        __ptr->marker = (opj_marker_info_t *)0x0;
        __ptr_00 = (opj_marker_info_t *)0x0;
      }
      else {
        memcpy(__ptr_00,poVar3->marker,sVar8);
      }
      uVar1 = poVar3->nb_of_tiles;
      __ptr->nb_of_tiles = uVar1;
      __ptr_01 = (opj_tile_index_t *)calloc((ulong)uVar1,0x38);
      __ptr->tile_index = __ptr_01;
      if (__ptr_01 == (opj_tile_index_t *)0x0) {
        free(__ptr_00);
      }
      else {
        if (poVar3->tile_index == (opj_tile_index_t *)0x0) {
          free(__ptr_01);
          __ptr->tile_index = (opj_tile_index_t *)0x0;
          return __ptr;
        }
        lVar10 = 0x18;
        uVar9 = 0;
        while( true ) {
          if (uVar1 == uVar9) {
            return __ptr;
          }
          poVar3 = p_j2k->cstr_index;
          poVar4 = poVar3->tile_index;
          uVar2 = *(uint *)((long)&poVar4->tileno + lVar10);
          *(uint *)((long)&__ptr_01->tileno + lVar10) = uVar2;
          sVar8 = (ulong)uVar2 * 0x18;
          pvVar7 = malloc(sVar8);
          *(void **)((long)&__ptr_01->current_nb_tps + lVar10) = pvVar7;
          if (pvVar7 == (void *)0x0) break;
          pvVar5 = *(void **)((long)&poVar4->current_nb_tps + lVar10);
          if (pvVar5 == (void *)0x0) {
            free(pvVar7);
            *(undefined8 *)((long)&__ptr_01->current_nb_tps + lVar10) = 0;
          }
          else {
            memcpy(pvVar7,pvVar5,sVar8);
          }
          poVar4 = poVar3->tile_index;
          uVar2 = *(uint *)((long)poVar4 + lVar10 + -0x14);
          *(uint *)((long)__ptr_01 + lVar10 + -0x14) = uVar2;
          sVar8 = (ulong)uVar2 * 0x18;
          pvVar7 = malloc(sVar8);
          *(void **)((long)__ptr_01 + lVar10 + -8) = pvVar7;
          if (pvVar7 == (void *)0x0) {
            ppoVar11 = &__ptr_01->marker;
            while (bVar12 = uVar9 != 0, uVar9 = uVar9 - 1, bVar12) {
              free(*ppoVar11);
              free((opj_tp_index_t *)ppoVar11[-2]);
              ppoVar11 = ppoVar11 + 7;
            }
            goto LAB_001e4cf3;
          }
          pvVar5 = *(void **)((long)poVar4 + lVar10 + -8);
          if (pvVar5 == (void *)0x0) {
            free(pvVar7);
            *(undefined8 *)((long)__ptr_01 + lVar10 + -8) = 0;
          }
          else {
            memcpy(pvVar7,pvVar5,sVar8);
          }
          *(undefined4 *)((long)&__ptr_01->tp_index + lVar10 + 4) = 0;
          *(undefined8 *)((long)&__ptr_01->marknum + lVar10) = 0;
          uVar9 = uVar9 + 1;
          lVar10 = lVar10 + 0x38;
        }
        ppoVar11 = &__ptr_01->marker;
        while (bVar12 = uVar9 != 0, uVar9 = uVar9 - 1, bVar12) {
          free(*ppoVar11);
          ppoVar11 = ppoVar11 + 7;
        }
LAB_001e4cf3:
        free(__ptr_01);
        free(__ptr_00);
      }
    }
    free(__ptr);
  }
  return (opj_codestream_index_t *)0x0;
}

Assistant:

opj_codestream_index_t* j2k_get_cstr_index(opj_j2k_v2_t* p_j2k)
{
 	opj_codestream_index_t* l_cstr_index = (opj_codestream_index_t*)
			opj_calloc(1,sizeof(opj_codestream_index_t));
	if (!l_cstr_index)
		return NULL;

	l_cstr_index->main_head_start = p_j2k->cstr_index->main_head_start;
	l_cstr_index->main_head_end = p_j2k->cstr_index->main_head_end;
	l_cstr_index->codestream_size = p_j2k->cstr_index->codestream_size;

	l_cstr_index->marknum = p_j2k->cstr_index->marknum;
	l_cstr_index->marker = (opj_marker_info_t*)opj_malloc(l_cstr_index->marknum*sizeof(opj_marker_info_t));
	if (!l_cstr_index->marker){
		opj_free( l_cstr_index);
		return NULL;
	}

	if (p_j2k->cstr_index->marker)
		memcpy(l_cstr_index->marker, p_j2k->cstr_index->marker, l_cstr_index->marknum * sizeof(opj_marker_info_t) );
	else{
		opj_free(l_cstr_index->marker);
		l_cstr_index->marker = NULL;
	}

	l_cstr_index->nb_of_tiles = p_j2k->cstr_index->nb_of_tiles;
	l_cstr_index->tile_index = (opj_tile_index_t*)opj_calloc(l_cstr_index->nb_of_tiles, sizeof(opj_tile_index_t) );
	if (!l_cstr_index->tile_index){
		opj_free( l_cstr_index->marker);
		opj_free( l_cstr_index);
		return NULL;
	}

	if (!p_j2k->cstr_index->tile_index){
		opj_free(l_cstr_index->tile_index);
		l_cstr_index->tile_index = NULL;
	}
	else {
		OPJ_UINT32 it_tile = 0;
		for (it_tile = 0; it_tile < l_cstr_index->nb_of_tiles; it_tile++ ){

			/* Tile Marker*/
			l_cstr_index->tile_index[it_tile].marknum = p_j2k->cstr_index->tile_index[it_tile].marknum;

			l_cstr_index->tile_index[it_tile].marker =
				(opj_marker_info_t*)opj_malloc(l_cstr_index->tile_index[it_tile].marknum*sizeof(opj_marker_info_t));

			if (!l_cstr_index->tile_index[it_tile].marker) {
				OPJ_UINT32 it_tile_free;

				for (it_tile_free=0; it_tile_free < it_tile; it_tile_free++){
					opj_free(l_cstr_index->tile_index[it_tile_free].marker);
				}

				opj_free( l_cstr_index->tile_index);
				opj_free( l_cstr_index->marker);
				opj_free( l_cstr_index);
				return NULL;
			}

			if (p_j2k->cstr_index->tile_index[it_tile].marker)
				memcpy(	l_cstr_index->tile_index[it_tile].marker,
						p_j2k->cstr_index->tile_index[it_tile].marker,
						l_cstr_index->tile_index[it_tile].marknum * sizeof(opj_marker_info_t) );
			else{
				opj_free(l_cstr_index->tile_index[it_tile].marker);
				l_cstr_index->tile_index[it_tile].marker = NULL;
			}

			/* Tile part index*/
			l_cstr_index->tile_index[it_tile].nb_tps = p_j2k->cstr_index->tile_index[it_tile].nb_tps;

			l_cstr_index->tile_index[it_tile].tp_index =
				(opj_tp_index_t*)opj_malloc(l_cstr_index->tile_index[it_tile].nb_tps*sizeof(opj_tp_index_t));

			if(!l_cstr_index->tile_index[it_tile].tp_index){
				OPJ_UINT32 it_tile_free;

				for (it_tile_free=0; it_tile_free < it_tile; it_tile_free++){
					opj_free(l_cstr_index->tile_index[it_tile_free].marker);
					opj_free(l_cstr_index->tile_index[it_tile_free].tp_index);
				}

				opj_free( l_cstr_index->tile_index);
				opj_free( l_cstr_index->marker);
				opj_free( l_cstr_index);
				return NULL;
			}

			if (p_j2k->cstr_index->tile_index[it_tile].tp_index){
				memcpy(	l_cstr_index->tile_index[it_tile].tp_index,
						p_j2k->cstr_index->tile_index[it_tile].tp_index,
						l_cstr_index->tile_index[it_tile].nb_tps * sizeof(opj_tp_index_t) );
			}
			else{
				opj_free(l_cstr_index->tile_index[it_tile].tp_index);
				l_cstr_index->tile_index[it_tile].tp_index = NULL;
			}

			/* Packet index (NOT USED)*/
			l_cstr_index->tile_index[it_tile].nb_packet = 0;
			l_cstr_index->tile_index[it_tile].packet_index = NULL;

		}
	}

	return l_cstr_index;
}